

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawCircleSector(Vector2 center,float radius,float startAngle,float endAngle,int segments,
                     Color color)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 local_cc;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 local_68;
  undefined4 uStack_64;
  
  fVar10 = (float)(~-(uint)(0.0 < radius) & 0x3dcccccd | (uint)radius & -(uint)(0.0 < radius));
  local_cc = endAngle;
  if (startAngle <= endAngle) {
    local_cc = startAngle;
    startAngle = endAngle;
  }
  fVar6 = startAngle - local_cc;
  fVar7 = ceilf(fVar6 / 90.0);
  if (segments < (int)fVar7) {
    fVar8 = -0.5 / fVar10 + 1.0;
    fVar8 = fVar8 * fVar8;
    fVar8 = acosf(fVar8 + fVar8 + -1.0);
    fVar8 = ceilf(6.2831855 / fVar8);
    uVar3 = (uint)((fVar8 * fVar6) / 360.0);
    segments = (int)fVar7;
    if (0 < (int)uVar3) {
      segments = uVar3;
    }
  }
  fVar6 = fVar6 / (float)segments;
  rlSetTexture(texShapes.id);
  uVar2 = texShapesRec._8_8_;
  uVar1 = texShapesRec._0_8_;
  rlBegin(7);
  local_88 = (float)uVar1;
  uStack_84 = SUB84(uVar1,4);
  uStack_a4 = center.y;
  local_68 = (float)uVar2;
  uStack_64 = SUB84(uVar2,4);
  local_68 = local_68 + local_88;
  uStack_64 = uStack_64 + uStack_84;
  uVar5 = 0;
  if (0 < (int)((long)segments / 2)) {
    uVar5 = (long)segments / 2 & 0xffffffff;
  }
  while( true ) {
    iVar4 = (int)uVar5;
    uVar5 = (ulong)(iVar4 - 1);
    local_a8 = center.x;
    if (iVar4 == 0) break;
    rlColor4ub(color.r,color.g,color.b,color.a);
    rlTexCoord2f(local_88 / (float)texShapes.width,uStack_84 / (float)texShapes.height);
    rlVertex2f(local_a8,uStack_a4);
    rlTexCoord2f(local_68 / (float)texShapes.width,uStack_84 / (float)texShapes.height);
    fVar9 = fVar6 + fVar6 + local_cc;
    fVar8 = fVar9 * 0.017453292;
    fVar7 = cosf(fVar8);
    fVar8 = sinf(fVar8);
    rlVertex2f(fVar7 * fVar10 + local_a8,fVar8 * fVar10 + uStack_a4);
    rlTexCoord2f(local_68 / (float)texShapes.width,uStack_64 / (float)texShapes.height);
    fVar7 = (fVar6 + local_cc) * 0.017453292;
    fVar8 = cosf(fVar7);
    fVar7 = sinf(fVar7);
    rlVertex2f(fVar8 * fVar10 + local_a8,fVar7 * fVar10 + uStack_a4);
    rlTexCoord2f(local_88 / (float)texShapes.width,uStack_64 / (float)texShapes.height);
    fVar7 = cosf(local_cc * 0.017453292);
    fVar8 = sinf(local_cc * 0.017453292);
    rlVertex2f(fVar7 * fVar10 + local_a8,fVar8 * fVar10 + uStack_a4);
    local_cc = fVar9;
  }
  if ((segments & 1U) != 0) {
    rlColor4ub(color.r,color.g,color.b,color.a);
    rlTexCoord2f(local_88 / (float)texShapes.width,uStack_84 / (float)texShapes.height);
    rlVertex2f(local_a8,uStack_a4);
    rlTexCoord2f(local_68 / (float)texShapes.width,uStack_64 / (float)texShapes.height);
    fVar7 = (fVar6 + local_cc) * 0.017453292;
    fVar6 = cosf(fVar7);
    fVar7 = sinf(fVar7);
    rlVertex2f(fVar6 * fVar10 + local_a8,fVar7 * fVar10 + uStack_a4);
    rlTexCoord2f(local_88 / (float)texShapes.width,uStack_64 / (float)texShapes.height);
    fVar6 = cosf(local_cc * 0.017453292);
    fVar7 = sinf(local_cc * 0.017453292);
    rlVertex2f(fVar6 * fVar10 + local_a8,fVar10 * fVar7 + uStack_a4);
    rlTexCoord2f(local_68 / (float)texShapes.width,uStack_84 / (float)texShapes.height);
    rlVertex2f(local_a8,uStack_a4);
  }
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawCircleSector(Vector2 center, float radius, float startAngle, float endAngle, int segments, Color color)
{
    if (radius <= 0.0f) radius = 0.1f;  // Avoid div by zero

    // Function expects (endAngle > startAngle)
    if (endAngle < startAngle)
    {
        // Swap values
        float tmp = startAngle;
        startAngle = endAngle;
        endAngle = tmp;
    }

    int minSegments = (int)ceilf((endAngle - startAngle)/90);

    if (segments < minSegments)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (int)((endAngle - startAngle)*ceilf(2*PI/th)/360);

        if (segments <= 0) segments = minSegments;
    }

    float stepLength = (endAngle - startAngle)/(float)segments;
    float angle = startAngle;

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlSetTexture(GetShapesTexture().id);
    Rectangle shapeRect = GetShapesTextureRectangle();

    rlBegin(RL_QUADS);

        // NOTE: Every QUAD actually represents two segments
        for (int i = 0; i < segments/2; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(center.x, center.y);

            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength*2.0f))*radius, center.y + sinf(DEG2RAD*(angle + stepLength*2.0f))*radius);

            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*radius, center.y + sinf(DEG2RAD*(angle + stepLength))*radius);

            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*radius, center.y + sinf(DEG2RAD*angle)*radius);

            angle += (stepLength*2.0f);
        }

        // NOTE: In case number of segments is odd, we add one last piece to the cake
        if ((((unsigned int)segments)%2) == 1)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(center.x, center.y);

            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*radius, center.y + sinf(DEG2RAD*(angle + stepLength))*radius);

            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*radius, center.y + sinf(DEG2RAD*angle)*radius);

            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(center.x, center.y);
        }

    rlEnd();

    rlSetTexture(0);
#else
    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < segments; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlVertex2f(center.x, center.y);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*radius, center.y + sinf(DEG2RAD*(angle + stepLength))*radius);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*radius, center.y + sinf(DEG2RAD*angle)*radius);

            angle += stepLength;
        }
    rlEnd();
#endif
}